

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O0

longlong dinic_flow(int s,int t)

{
  bool bVar1;
  int iVar2;
  int local_44;
  int pushed;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  int local_2c;
  int *local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  long local_18;
  longlong flow;
  int t_local;
  int s_local;
  
  local_18 = 0;
  flow._0_4_ = t;
  flow._4_4_ = s;
  while( true ) {
    local_20._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::dis);
    local_28 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::dis);
    local_2c = -1;
    std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (local_20,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_28,
               &local_2c);
    bVar1 = bfs_dinic(flow._4_4_,(int)flow);
    if (!bVar1) break;
    local_38._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::ptr);
    _pushed = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::ptr);
    local_44 = 0;
    std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (local_38,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_pushed,
               &local_44);
    while (iVar2 = dfs_dinic(flow._4_4_,(int)flow,1000000000), iVar2 != 0) {
      local_18 = iVar2 + local_18;
    }
  }
  return local_18;
}

Assistant:

long long dinic_flow(int s, int t) {
    long long flow = 0;
     
    while (true) {
        fill(dis.begin(), dis.end(), -1);
        
        if (!bfs_dinic(s, t)) {
            break;
        }
        
        fill(ptr.begin(), ptr.end(), 0);
        
        while (int pushed = dfs_dinic(s, t, INF)) {
            flow += pushed;
        }
    }
    return flow;
}